

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_12d03c0::Scenario::DisconnectedPeer(Scenario *this,NodeId peer)

{
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *__alloc;
  long lVar1;
  Runner *pRVar2;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__first;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__last;
  size_type __n;
  pointer __result;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar3;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->m_runner;
  ppVar4 = (pRVar2->actions).
           super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 == (pRVar2->actions).
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __alloc = &pRVar2->actions;
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(__alloc,1,"vector::_M_realloc_insert");
    __first = (pRVar2->actions).
              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)ppVar4 - (long)__first;
    __result = _GLOBAL__N_1::std::
               _Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ::_M_allocate(&__alloc->
                              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                             ,__n);
    *(rep *)((long)__result + lVar5) = (this->m_now).__r;
    *(Runner **)((long)__result + lVar5 + 8) = pRVar2;
    *(NodeId *)((long)__result + lVar5 + 0x10) = peer;
    *(code **)((long)__result + lVar5 + 0x20) =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_invoke;
    *(code **)((long)__result + lVar5 + 0x18) =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_manager;
    ppVar3 = std::
             __relocate_a_1<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
                       (__first,ppVar4,__result,
                        (allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                         *)__alloc);
    ppVar4 = std::
             __relocate_a_1<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
                       (ppVar4,__last,ppVar3 + 1,
                        (allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                         *)__alloc);
    _GLOBAL__N_1::std::
    _Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ::_M_deallocate(&__alloc->
                     super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                    ,__first,((long)(pRVar2->actions).
                                    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)__first) / 0x28);
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + __n;
  }
  else {
    (ppVar4->first).__r = (this->m_now).__r;
    *(Runner **)&(ppVar4->second).super__Function_base._M_functor = pRVar2;
    *(NodeId *)((long)&(ppVar4->second).super__Function_base._M_functor + 8) = peer;
    (ppVar4->second)._M_invoker =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_invoke;
    (ppVar4->second).super__Function_base._M_manager =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_manager;
    ppVar4 = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  (pRVar2->actions).
  super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DisconnectedPeer(NodeId peer)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.DisconnectedPeer(peer);
            runner.txrequest.SanityCheck();
        });
    }